

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ServiceGenerator::GenerateStub
          (ServiceGenerator *this,Printer *printer)

{
  long lVar1;
  mapped_type *pmVar2;
  int i;
  ServiceDescriptor *in_RDX;
  Descriptor *descriptor;
  long lVar3;
  Printer *this_00;
  ulong uVar4;
  allocator<char> local_b9;
  long local_b8;
  ServiceGenerator *local_b0;
  ulong local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_70;
  key_type local_50;
  
  local_b0 = this;
  ClassName_abi_cxx11_((string *)&vars,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "public static Stub newStub(\n    com.google.protobuf.RpcChannel channel) {\n  return new Stub(channel);\n}\n\npublic static final class Stub extends $classname$ implements Interface {\n"
                     ,"classname",(string *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "private Stub(com.google.protobuf.RpcChannel channel) {\n  this.channel = channel;\n}\n\nprivate final com.google.protobuf.RpcChannel channel;\n\npublic com.google.protobuf.RpcChannel getChannel() {\n  return channel;\n}\n"
                    );
  lVar3 = 0;
  uVar4 = 0;
  while ((long)uVar4 < (long)*(int *)(local_b0->descriptor_ + 0x20)) {
    lVar1 = *(long *)(local_b0->descriptor_ + 0x28);
    this_00 = printer;
    local_b8 = lVar3;
    io::Printer::Print(printer,"\n");
    GenerateMethodSignature
              ((ServiceGenerator *)this_00,printer,(MethodDescriptor *)(lVar1 + lVar3),IS_CONCRETE);
    io::Printer::Print(printer," {\n");
    io::Printer::Indent(printer);
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8 = uVar4;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(uVar4 & 0xffffffff),i);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"index",&local_b9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    ClassName_abi_cxx11_(&local_70,*(java **)(lVar1 + 0x20 + local_b8),descriptor);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"output",&local_b9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    io::Printer::Print(printer,&vars,
                       "channel.callMethod(\n  getDescriptor().getMethods().get($index$),\n  controller,\n  request,\n  $output$.getDefaultInstance(),\n  com.google.protobuf.RpcUtil.generalizeCallback(\n    done,\n    $output$.class,\n    $output$.getDefaultInstance()));\n"
                      );
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&vars);
    lVar3 = local_b8 + 0x30;
    uVar4 = local_a8 + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ServiceGenerator::GenerateStub(io::Printer* printer) {
  printer->Print(
    "public static Stub newStub(\n"
    "    com.google.protobuf.RpcChannel channel) {\n"
    "  return new Stub(channel);\n"
    "}\n"
    "\n"
    "public static final class Stub extends $classname$ implements Interface {"
    "\n",
    "classname", ClassName(descriptor_));
  printer->Indent();

  printer->Print(
    "private Stub(com.google.protobuf.RpcChannel channel) {\n"
    "  this.channel = channel;\n"
    "}\n"
    "\n"
    "private final com.google.protobuf.RpcChannel channel;\n"
    "\n"
    "public com.google.protobuf.RpcChannel getChannel() {\n"
    "  return channel;\n"
    "}\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(" {\n");
    printer->Indent();

    map<string, string> vars;
    vars["index"] = SimpleItoa(i);
    vars["output"] = ClassName(method->output_type());
    printer->Print(vars,
      "channel.callMethod(\n"
      "  getDescriptor().getMethods().get($index$),\n"
      "  controller,\n"
      "  request,\n"
      "  $output$.getDefaultInstance(),\n"
      "  com.google.protobuf.RpcUtil.generalizeCallback(\n"
      "    done,\n"
      "    $output$.class,\n"
      "    $output$.getDefaultInstance()));\n");

    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");
}